

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

UnknownFieldSet * __thiscall
google::protobuf::UnknownFieldSet::AddGroup(UnknownFieldSet *this,int number)

{
  iterator __position;
  anon_union_8_5_912831f5_for_data_ aVar1;
  vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *this_00;
  UnknownField field;
  UnknownField local_20;
  
  local_20.type_ = 4;
  local_20.number_ = number;
  aVar1.group_ = (UnknownFieldSet *)operator_new(8);
  (aVar1.group_)->fields_ =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       0x0;
  this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *
            )this->fields_;
  local_20.data_.group_ = aVar1.group_;
  if (this_00 ==
      (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *)0x0)
  {
    this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>
               *)operator_new(0x18);
    *(undefined8 *)&this_00->field_0x0 = 0;
    *(undefined8 *)(this_00 + 8) = 0;
    *(undefined8 *)(this_00 + 0x10) = 0;
    this->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         this_00;
  }
  __position._M_current = *(UnknownField **)(this_00 + 8);
  if (__position._M_current == *(UnknownField **)(this_00 + 0x10)) {
    std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>::
    _M_realloc_insert<google::protobuf::UnknownField_const&>(this_00,__position,&local_20);
  }
  else {
    (__position._M_current)->number_ = local_20.number_;
    (__position._M_current)->type_ = local_20.type_;
    ((__position._M_current)->data_).group_ = (UnknownFieldSet *)local_20.data_;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
    local_20.data_.group_ = aVar1.group_;
  }
  return (UnknownFieldSet *)local_20.data_.varint_;
}

Assistant:

UnknownFieldSet* UnknownFieldSet::AddGroup(int number) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_GROUP);
  field.data_.group_ = new UnknownFieldSet;
  if (fields_ == NULL) fields_ = new std::vector<UnknownField>();
  fields_->push_back(field);
  return field.data_.group_;
}